

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O1

int ExorLinkCubeIteratorStart(Cube **pGroup,Cube *pC1,Cube *pC2,cubedist Dist)

{
  drow *pdVar1;
  drow *pdVar2;
  int iVar3;
  drow dVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Cube *pCVar9;
  byte bVar10;
  uint uVar11;
  int *piVar12;
  int (*paiVar13) [4];
  long lVar14;
  drow *pdVar15;
  long lVar16;
  int iVar17;
  int (*paiVar18) [3];
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  
  if (pC1 == (Cube *)0x0) {
    __assert_fail("pC1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x180,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  if (pC2 != (Cube *)0x0) {
    if (fWorking != '\x01') {
      nCubes = Dist + DIST4;
      nCubesInGroup = s_ELnCubes[(int)Dist];
      nGroups = s_ELnGroups[Dist];
      nDist = Dist;
      pCA = pC1;
      pCB = pC2;
      iVar6 = FindDiffVars(DiffVars,pC1,pC2);
      iVar3 = nCubes;
      uVar23 = (ulong)(uint)nCubes;
      iVar7 = 0;
      if (nCubes == iVar6) {
        if (0 < (long)g_CoverInfo.nWordsIn) {
          memcpy(DammyBitData,pCA->pCubeDataIn,(long)g_CoverInfo.nWordsIn << 2);
        }
        piVar12 = DiffVars + 1;
        if (-1 < DiffVars[0]) {
          piVar12 = DiffVars;
        }
        uVar8 = (DiffVars[0] >> 0x1f) + iVar3;
        nDiffVarsIn = uVar8;
        pDiffVars = piVar12;
        if (uVar8 != 0 && SCARRY4(DiffVars[0] >> 0x1f,iVar3) == (int)uVar8 < 0) {
          lVar14 = 0;
          uVar20 = (ulong)uVar8;
          do {
            iVar7 = *(int *)((long)piVar12 + lVar14) >> 4;
            uVar11 = *(int *)((long)piVar12 + lVar14) * 2 & 0x1e;
            DammyBitData[iVar7] = DammyBitData[iVar7] & ~(3 << (sbyte)uVar11);
            *(int *)((long)DiffVarWords + lVar14) = iVar7;
            *(uint *)((long)DiffVarBits + lVar14) = uVar11;
            lVar14 = lVar14 + 4;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        MaskLiterals = 0;
        iVar7 = (int)pCA->a;
        StartingLiterals = iVar7;
        if (0 < (int)uVar8) {
          uVar11 = 0;
          pdVar1 = pCA->pCubeDataIn;
          pdVar15 = pCB->pCubeDataIn;
          lVar14 = 0;
          lVar22 = 0;
          do {
            iVar17 = *(int *)((long)DiffVarWords + lVar14);
            bVar10 = (byte)*(undefined4 *)((long)DiffVarBits + lVar14);
            uVar21 = pdVar1[iVar17] >> (bVar10 & 0x1f) & 3;
            *(uint *)((long)DiffVarValues[0] + lVar22) = uVar21;
            if (uVar21 != 3) {
              uVar11 = uVar11 | 1 << ((uint)lVar14 & 0x1f);
              iVar7 = iVar7 + -1;
              MaskLiterals = uVar11;
              StartingLiterals = iVar7;
            }
            uVar21 = pdVar15[iVar17] >> (bVar10 & 0x1f) & 3;
            *(uint *)((long)DiffVarValues[0] + lVar22 + 4) = uVar21;
            if (uVar21 != 3) {
              uVar11 = uVar11 | 2 << ((byte)lVar14 & 0x1f);
              MaskLiterals = uVar11;
            }
            uVar21 = uVar21 ^ *(uint *)((long)DiffVarValues[0] + lVar22);
            *(uint *)((long)DiffVarValues[0] + lVar22 + 8) = uVar21;
            if (uVar21 != 3) {
              uVar11 = uVar11 | 4 << ((byte)lVar14 & 0x1f);
              MaskLiterals = uVar11;
            }
            lVar22 = lVar22 + 0xc;
            lVar14 = lVar14 + 4;
          } while ((ulong)uVar8 * 0xc != lVar22);
        }
        dVar4 = MaskLiterals;
        lVar14 = (long)nCubesInGroup;
        if (0 < lVar14) {
          lVar22 = 0;
          do {
            *(uint *)((long)CubeLiterals + lVar22) =
                 (uint)BitCount[*(uint *)((long)s_CubeLitMasks[Dist] + lVar22) & dVar4];
            lVar22 = lVar22 + 4;
          } while (lVar14 * 4 != lVar22);
        }
        iVar7 = nGroups;
        lVar14 = (long)nGroups;
        if (0 < lVar14) {
          paiVar13 = s_ELGroupRules[Dist];
          lVar22 = 0;
          do {
            GroupCosts[lVar22] = 0;
            if (0 < iVar3) {
              iVar17 = GroupCosts[lVar22];
              uVar20 = 0;
              do {
                iVar17 = iVar17 + CubeLiterals[(*(int (*) [4])*paiVar13)[uVar20]];
                uVar20 = uVar20 + 1;
              } while (uVar23 != uVar20);
              GroupCosts[lVar22] = iVar17;
            }
            lVar22 = lVar22 + 1;
            paiVar13 = paiVar13 + 1;
          } while (lVar22 != lVar14);
        }
        GroupCostBest = -1;
        if (0 < iVar7) {
          iVar7 = -1;
          piVar12 = GroupCosts;
          lVar22 = 0;
          do {
            iVar17 = *piVar12;
            if (iVar7 < iVar17) {
              GroupCostBestNum = (int)lVar22;
              iVar7 = iVar17;
              GroupCostBest = iVar17;
            }
            lVar22 = lVar22 + 1;
            piVar12 = piVar12 + 1;
          } while (lVar14 != lVar22);
        }
        LastGroup = 0;
        if (0 < nCubes) {
          lVar14 = 0;
          do {
            CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][lVar14];
            LastGroup = LastGroup | s_BitMasks[CubeNum];
            pCVar9 = GetFreeCube();
            lVar22 = (long)CubeNum;
            ELCubes[lVar22] = pCVar9;
            if (0 < g_CoverInfo.nWordsIn) {
              pdVar1 = pCVar9->pCubeDataIn;
              pdVar15 = DammyBitData;
              lVar16 = 0;
              do {
                pdVar1[lVar16] = *pdVar15;
                lVar16 = lVar16 + 1;
                pdVar15 = pdVar15 + 1;
              } while (lVar16 < g_CoverInfo.nWordsIn);
            }
            NewZ = 0;
            if (DiffVars[0] < 0) {
              iVar7 = s_ELCubeRules[Dist][lVar22][nDiffVarsIn];
              if (iVar7 == 0) {
                if (0 < g_CoverInfo.nWordsOut) {
                  NewZ = 0;
                  pdVar1 = pCA->pCubeDataOut;
                  pdVar15 = pCVar9->pCubeDataOut;
                  lVar16 = 0;
                  do {
                    uVar8 = pdVar1[lVar16];
                    pdVar15[lVar16] = uVar8;
                    NewZ = NewZ + (uint)BitCount[uVar8 >> 0x10] + (uint)BitCount[uVar8 & 0xffff];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < g_CoverInfo.nWordsOut);
                }
              }
              else if (iVar7 == 1) {
                if (0 < g_CoverInfo.nWordsOut) {
                  NewZ = 0;
                  pdVar1 = pCB->pCubeDataOut;
                  pdVar15 = pCVar9->pCubeDataOut;
                  lVar16 = 0;
                  do {
                    uVar8 = pdVar1[lVar16];
                    pdVar15[lVar16] = uVar8;
                    NewZ = NewZ + (uint)BitCount[uVar8 >> 0x10] + (uint)BitCount[uVar8 & 0xffff];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < g_CoverInfo.nWordsOut);
                }
              }
              else if ((iVar7 == 2) && (0 < g_CoverInfo.nWordsOut)) {
                NewZ = 0;
                pdVar1 = pCA->pCubeDataOut;
                pdVar15 = pCB->pCubeDataOut;
                pdVar2 = pCVar9->pCubeDataOut;
                lVar16 = 0;
                do {
                  uVar8 = pdVar15[lVar16] ^ pdVar1[lVar16];
                  pdVar2[lVar16] = uVar8;
                  NewZ = NewZ + (uint)BitCount[uVar8 >> 0x10] + (uint)BitCount[uVar8 & 0xffff];
                  lVar16 = lVar16 + 1;
                } while (lVar16 < g_CoverInfo.nWordsOut);
              }
            }
            else {
              if (0 < g_CoverInfo.nWordsOut) {
                pdVar1 = pCA->pCubeDataOut;
                pdVar15 = pCVar9->pCubeDataOut;
                lVar16 = 0;
                do {
                  pdVar15[lVar16] = pdVar1[lVar16];
                  lVar16 = lVar16 + 1;
                } while (lVar16 < g_CoverInfo.nWordsOut);
              }
              NewZ = (int)pCA->z;
            }
            lVar16 = (long)nDiffVarsIn;
            if (0 < lVar16) {
              pdVar1 = pCVar9->pCubeDataIn;
              paiVar18 = DiffVarValues;
              lVar19 = 0;
              do {
                pdVar1[*(int *)((long)DiffVarWords + lVar19)] =
                     pdVar1[*(int *)((long)DiffVarWords + lVar19)] |
                     (*paiVar18)[*(int *)((long)s_ELCubeRules[Dist][lVar22] + lVar19)] <<
                     (*(byte *)((long)DiffVarBits + lVar19) & 0x1f);
                lVar19 = lVar19 + 4;
                paiVar18 = paiVar18 + 1;
              } while (lVar16 * 4 != lVar19);
            }
            pCVar9->a = (short)CubeLiterals[lVar22] + (short)StartingLiterals;
            pCVar9->z = (short)NewZ;
            iVar7 = ComputeQCostBits(pCVar9);
            pCVar9 = ELCubes[CubeNum];
            pCVar9->q = (short)iVar7;
            iVar7 = g_CoverInfo.cIDs + 1;
            bVar5 = (byte)g_CoverInfo.cIDs;
            g_CoverInfo.cIDs = iVar7;
            pCVar9->ID = bVar5;
            if (iVar7 == 0x100) {
              g_CoverInfo.cIDs = 1;
            }
            pGroup[lVar14] = pCVar9;
            lVar14 = lVar14 + 1;
          } while (lVar14 < nCubes);
        }
        VisitedGroups = VisitedGroups | s_BitMasks[GroupCostBestNum];
        GroupOrder[0] = GroupCostBestNum;
        nVisitedGroups = 1;
        iVar7 = 1;
      }
      fWorking = iVar3 == iVar6;
      return iVar7;
    }
    __assert_fail("!fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x182,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  __assert_fail("pC2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                ,0x181,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
}

Assistant:

int ExorLinkCubeIteratorStart( Cube** pGroup, Cube* pC1, Cube* pC2, cubedist Dist )
// this function starts the Exor-Link iterator, which iterates
// through the cube groups starting from the group with min literals
// returns 1 on success, returns 0 if the cubes have wrong distance
{
    int i, c;

    // check that everything is okey
    assert( pC1 != NULL );
    assert( pC2 != NULL );
    assert( !fWorking );

    nDist = Dist;
    nCubes = Dist + 2;
    nCubesInGroup = s_ELnCubes[nDist];
    nGroups = s_ELnGroups[Dist];
    pCA = pC1;
    pCB = pC2;
    // find what variables are different in these two cubes
    // FindDiffVars returns DiffVars[0] < 0, if the output is different
    nDifferentVars = FindDiffVars( DiffVars, pCA, pCB );
    if ( nCubes != nDifferentVars )
    {
//      cout << "ExorLinkCubeIterator(): Distance mismatch";
//      cout << " nCubes = " << nCubes << " nDiffVars = " << nDifferentVars << endl;
        fWorking = 0;
        return 0;
    }

    // copy the input variable cube data into DammyBitData[]
    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
        DammyBitData[i] = pCA->pCubeDataIn[i];

    // find the number of different input variables
    nDiffVarsIn = ( DiffVars[0] >= 0 )? nCubes: nCubes-1;
    // assign the pointer to the place where the number of diff input vars is stored
    pDiffVars   = ( DiffVars[0] >= 0 )? DiffVars: DiffVars+1;
    // find the bit offsets and remove different variables
    for ( i = 0; i < nDiffVarsIn; i++ )
    {
        DiffVarWords[i] = ((2*pDiffVars[i]) >> LOGBPI) ;
        DiffVarBits[i]  = ((2*pDiffVars[i]) & BPIMASK);
        // clear this position
        DammyBitData[ DiffVarWords[i] ] &= ~( 3 << DiffVarBits[i] );
    }

    // extract the values from the cubes and create the mask of literals
    MaskLiterals = 0;
    // initialize the base for literal counts
    StartingLiterals = pCA->a;
    for ( i = 0, BitShift = 0; i < nDiffVarsIn; i++, BitShift++ )
    {
        DiffVarValues[i][0] = ( pCA->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][0] != VAR_ABS )
        {
            MaskLiterals |= ( 1 << BitShift );
            // update the base for literal counts
            StartingLiterals--;
        }
        BitShift++;

        DiffVarValues[i][1] = ( pCB->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][1] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;

        DiffVarValues[i][2] = DiffVarValues[i][0] ^ DiffVarValues[i][1];
        if ( DiffVarValues[i][2] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;
    }

    // count the number of additional literals in each cube of the group
    for ( i = 0; i < nCubesInGroup; i++ )
        CubeLiterals[i] = BitCount[ MaskLiterals & s_CubeLitMasks[Dist][i] ];

    // compute the costs of all groups
    for ( i = 0; i < nGroups; i++ )
        // go over all cubes in the group
        for ( GroupCosts[i] = 0, c = 0; c < nCubes; c++ )
            GroupCosts[i] += CubeLiterals[ s_ELGroupRules[Dist][i][c] ];

    // find the best cost group
    if ( fMinLitGroupsFirst[Dist] ) 
    { // find the minimum cost group
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }
    else 
    { // find the maximum cost group
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }

    // create the cubes with min number of literals needed for the group
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        // bring a cube from the free cube list
        ELCubes[CubeNum] = GetFreeCube();

        // copy the input bit data into the cube 
        for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
            ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

        // copy the output bit data into the cube
        NewZ = 0;
        if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
        {
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
            NewZ = pCA->z;
        }
        else // the output is involved
        { // determine where the output information comes from
            Value = s_ELCubeRules[Dist][CubeNum][nDiffVarsIn];
            if ( Value == vs0 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vs1 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vsX )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
        }

        // set the variables that should be there
        for ( i = 0; i < nDiffVarsIn; i++ )
        {
            Value = DiffVarValues[i][ s_ELCubeRules[Dist][CubeNum][i] ];
            ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
        }

        // set the number of literals
        ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
        ELCubes[CubeNum]->z = NewZ;
        ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );

        // assign the ID
        ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the first visited group number
    GroupOrder[0] = GroupCostBestNum;
    // increment the counter of visited groups
    nVisitedGroups = 1;
    fWorking = 1;
    return 1;
}